

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgram.cpp
# Opt level: O2

int __thiscall zmq::dgram_t::xrecv(dgram_t *this,msg_t *msg_)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  char *in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)msg_;
  iVar1 = msg_t::close(msg_,(int)msg_);
  __buf = extraout_RDX;
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    ctx = (EVP_PKEY_CTX *)0x18cdb5;
    in_RCX = 
    "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dgram.cpp"
    ;
    fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dgram.cpp"
            ,0x8c);
    fflush(_stderr);
    zmq_abort(pcVar4);
    __buf = extraout_RDX_00;
  }
  if ((this->_pipe != (pipe_t *)0x0) &&
     (ctx = (EVP_PKEY_CTX *)msg_, sVar2 = pipe_t::read(this->_pipe,(int)msg_,__buf,(size_t)in_RCX),
     (char)sVar2 != '\0')) {
    this->_last_in = this->_pipe;
    return 0;
  }
  iVar1 = msg_t::init(msg_,ctx);
  piVar3 = __errno_location();
  if (iVar1 != 0) {
    pcVar4 = strerror(*piVar3);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dgram.cpp"
            ,0x91);
    fflush(_stderr);
    zmq_abort(pcVar4);
  }
  *piVar3 = 0xb;
  return -1;
}

Assistant:

int zmq::dgram_t::xrecv (msg_t *msg_)
{
    //  Deallocate old content of the message.
    int rc = msg_->close ();
    errno_assert (rc == 0);

    if (!_pipe || !_pipe->read (msg_)) {
        //  Initialise the output parameter to be a 0-byte message.
        rc = msg_->init ();
        errno_assert (rc == 0);

        errno = EAGAIN;
        return -1;
    }
    _last_in = _pipe;

    return 0;
}